

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

xmlChar * xmlEscapeText(xmlChar *text,int flags)

{
  ulong uVar1;
  byte bVar2;
  uint val;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  int iVar5;
  byte *__src;
  byte *str;
  xmlChar *__dest;
  int iVar6;
  ulong uVar7;
  size_t __n;
  size_t sStack_60;
  byte *local_58;
  int chunkSize;
  uint local_4c;
  xmlChar *local_48;
  uint local_40;
  char buf [12];
  
  pxVar3 = (xmlChar *)(*xmlMalloc)(0x33);
  if (pxVar3 == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  local_4c = flags & 5;
  uVar7 = 0x32;
  __src = text;
  __dest = pxVar3;
  local_40 = flags;
LAB_0012e760:
  if (*text == 0) {
    *__dest = '\0';
    return pxVar3;
  }
  chunkSize = 1;
  iVar6 = (int)text + -1;
  iVar5 = (int)text + -3;
  str = text;
  do {
    text = str + 1;
    bVar2 = *str;
    if ((long)(char)bVar2 < 0) {
      if ((flags & 2U) != 0) break;
    }
    else if (""[(char)bVar2] == '\0') break;
    iVar6 = iVar6 + 1;
    iVar5 = iVar5 + 1;
    str = text;
  } while( true );
  if (bVar2 == 0) {
    chunkSize = 0;
    local_58 = (byte *)0x1d563f;
    sStack_60 = 0;
  }
  else {
    local_58 = str;
    if (bVar2 == 0x26) {
      if ((local_4c == 5) && (*text == 0x7b)) {
        pxVar4 = xmlStrchr(str,'}');
        if (pxVar4 == (xmlChar *)0x0) {
          local_58 = (byte *)0x1bf7e5;
          sStack_60 = 5;
        }
        else {
          chunkSize = (int)pxVar4 - iVar6;
          sStack_60 = (size_t)chunkSize;
        }
      }
      else {
        local_58 = (byte *)0x1bf7e5;
        sStack_60 = 5;
      }
    }
    else if (bVar2 == 0x3c) {
      if ((((local_4c != 5) || (*text != 0x21)) || (str[2] != 0x2d)) || (str[3] != 0x2d)) {
        local_58 = (byte *)0x1bf7db;
        goto LAB_0012e8a8;
      }
      pxVar4 = xmlStrstr(str,"-->");
      if (pxVar4 == (xmlChar *)0x0) {
        local_58 = (byte *)0x1bf7db;
        sStack_60 = 4;
      }
      else {
        chunkSize = (int)pxVar4 - iVar5;
        sStack_60 = (size_t)chunkSize;
      }
    }
    else if (bVar2 == 0x3e) {
      local_58 = (byte *)0x1bf7e0;
LAB_0012e8a8:
      sStack_60 = 4;
    }
    else if (((flags & 8U) == 0) || (bVar2 != 0x22)) {
      if (((flags & 4U) == 0) && (bVar2 == 0xd)) {
        local_58 = (byte *)0x1bf7eb;
        sStack_60 = 5;
      }
      else if (((flags & 2U) == 0) || (-1 < (char)bVar2)) {
        if ((bVar2 == 0xd) ||
           ((((flags & 0x14U) != 0 || (0x1f < bVar2)) || ((byte)(bVar2 - 9) < 2)))) {
          if (*text != 0) goto LAB_0012e760;
          chunkSize = 0;
          local_58 = (byte *)0x1d563f;
          sStack_60 = 0;
          str = text;
        }
        else {
          local_58 = (byte *)0x1d563f;
          sStack_60 = 0;
        }
      }
      else {
        chunkSize = 4;
        local_48 = __dest;
        val = xmlGetUTF8Char(str,&chunkSize);
        if ((int)val < 0) {
          chunkSize = 1;
LAB_0012e9ba:
          val = 0xfffd;
        }
        else if ((flags & 0x10U) == 0) {
          if (val < 0x100) {
            if (val < 0x20) {
              if (4 < val - 9) goto LAB_0012e9ba;
              val = *(uint *)(&DAT_001bf880 + (ulong)(val - 9) * 4);
            }
          }
          else if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val))
          goto LAB_0012e9ba;
        }
        iVar5 = xmlSerializeHexCharRef(buf,val);
        sStack_60 = (size_t)iVar5;
        __dest = local_48;
        local_58 = (byte *)buf;
      }
    }
    else {
      local_58 = (byte *)0x1bf000;
      sStack_60 = 6;
    }
  }
  __n = (long)str - (long)__src;
  uVar1 = __n + sStack_60;
  text = str + chunkSize;
  local_48 = (xmlChar *)sStack_60;
  if (uVar1 <= uVar7 - ((long)__dest - (long)pxVar3)) {
LAB_0012ea72:
    memcpy(__dest,__src,__n);
    pxVar4 = local_48;
    memcpy(__dest + __n,local_58,(size_t)local_48);
    __dest = __dest + __n + (long)pxVar4;
    __src = text;
    flags = local_40;
    goto LAB_0012e760;
  }
  if ((-1 < (long)uVar7) && (uVar1 <= (uVar7 ^ 0x7fffffffffffffff))) {
    iVar5 = (int)uVar1 + (int)uVar7 << (*text != 0);
    pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar3,(long)(iVar5 + 1));
    if (pxVar4 != (xmlChar *)0x0) {
      uVar7 = (ulong)iVar5;
      __dest = pxVar4 + ((long)__dest - (long)pxVar3);
      pxVar3 = pxVar4;
      goto LAB_0012ea72;
    }
  }
  (*xmlFree)(pxVar3);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlEscapeText(const xmlChar *text, int flags) {
    const xmlChar *cur;
    xmlChar *buffer;
    xmlChar *out;
    const xmlChar *unescaped;
    size_t size = 50;

    buffer = xmlMalloc(size + 1);
    if (buffer == NULL)
        return(NULL);
    out = buffer;

    cur = text;
    unescaped = cur;

    while (*cur != '\0') {
        char buf[12];
	const xmlChar *end;
        const xmlChar *repl;
        size_t used;
        size_t replSize;
        size_t unescapedSize;
        size_t totalSize;
        int chunkSize = 1;
        int c;

        /* accelerator */
	while (1) {
            c = *cur;

            if (c < 0x80) {
                if (!xmlEscapeSafe[*cur])
                    break;
            } else {
               if (flags & XML_ESCAPE_NON_ASCII)
                   break;
            }
            cur += 1;
        }

        if (c == 0) {
            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
        } else if (c == '<') {
	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
                chunkSize = (end - cur) + 3;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&lt;";
                replSize = 4;
            }
	} else if (c == '>') {
            repl = BAD_CAST "&gt;";
            replSize = 4;
	} else if (c == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if ((flags & XML_ESCAPE_HTML) && (flags & XML_ESCAPE_ATTR) &&
                (cur[1] == '{') && (end = xmlStrchr(cur, '}'))) {
                chunkSize = (end - cur) + 1;
                repl = cur;
                replSize = chunkSize;
	    } else {
                repl = BAD_CAST "&amp;";
                replSize = 5;
            }
	} else if ((flags & XML_ESCAPE_QUOT) && (c == '"')) {
            repl = BAD_CAST "&quot;";
            replSize = 6;
	} else if (((flags & XML_ESCAPE_HTML) == 0) && (c == '\r')) {
	    repl = BAD_CAST "&#13;";
            replSize = 5;
	} else if ((flags & XML_ESCAPE_NON_ASCII) && (c >= 0x80)) {
            int val;

            chunkSize = 4;
            val = xmlGetUTF8Char(cur, &chunkSize);
            if (val < 0) {
                val = 0xFFFD;
                chunkSize = 1;
            } else if (((flags & XML_ESCAPE_ALLOW_INVALID) == 0) &&
                       (!IS_CHAR(val))) {
                val = 0xFFFD;
            }

            replSize = xmlSerializeHexCharRef(buf, val);
            repl = BAD_CAST buf;
	} else if ((flags & (XML_ESCAPE_ALLOW_INVALID | XML_ESCAPE_HTML)) ||
                   (c >= 0x20) ||
	           (c == '\n') || (c == '\t') || (c == '\r')) {
	    /* default case, just copy */
            cur += 1;
            if (*cur != 0)
                continue;

            chunkSize = 0;
            repl = BAD_CAST "";
            replSize = 0;
	} else {
            /* ignore */
            repl = BAD_CAST "";
            replSize = 0;
        }

        used = out - buffer;
        unescapedSize = cur - unescaped;
        totalSize = unescapedSize + replSize;

	cur += chunkSize;

        if (totalSize > size - used) {
            xmlChar *tmp;
            int newSize;

            if ((size > (SIZE_MAX - 1) / 2) ||
                (totalSize > (SIZE_MAX - 1) / 2 - size)) {
                xmlFree(buffer);
                return(NULL);
            }
            newSize = size + totalSize;
            if (*cur != 0)
                newSize *= 2;
            tmp = xmlRealloc(buffer, newSize + 1);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            size = newSize;
            out = buffer + used;
        }

        memcpy(out, unescaped, unescapedSize);
        out += unescapedSize;
        memcpy(out, repl, replSize);
        out += replSize;

        unescaped = cur;
    }

    *out = 0;
    return(buffer);
}